

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_world_help(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"text");
    pcVar3 = string_append(*(char **)((long)pvVar2 + 8),pcVar3);
    *(char **)((long)pvVar2 + 8) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_world_help(struct parser *p) {
	struct level_map *map = parser_priv(p);
	const char *desc;

	if (!map)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	desc = parser_getstr(p, "text");
	map->help = string_append(map->help, desc);
	return PARSE_ERROR_NONE;
}